

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpaintengine_raster.cpp
# Opt level: O0

void __thiscall QRasterPaintEngine::fillRect(QRasterPaintEngine *this,QRectF *r,QColor *color)

{
  QRasterPaintEnginePrivate *this_00;
  QRasterPaintEngineState *pQVar1;
  QClipData *pQVar2;
  QSpanData *in_RDX;
  QColor *in_RDI;
  long in_FS_OFFSET;
  float fVar3;
  QColor QVar4;
  QRasterPaintEngine *unaff_retaddr;
  QRasterPaintEngineState *s;
  QRasterPaintEnginePrivate *d;
  QColor *pQVar5;
  QColor *in_stack_ffffffffffffffd8;
  undefined4 local_20;
  ushort uStack_1c;
  undefined2 in_stack_fffffffffffffff6;
  QRectF *r_00;
  int alpha;
  
  r_00 = *(QRectF **)(in_FS_OFFSET + 0x28);
  pQVar5 = in_RDI;
  this_00 = d_func((QRasterPaintEngine *)0x5690f3);
  alpha = (int)((ulong)pQVar5 >> 0x20);
  pQVar1 = state((QRasterPaintEngine *)0x569101);
  QVar4 = qPremultiplyWithExtraAlpha(in_stack_ffffffffffffffd8,alpha);
  local_20 = QVar4.ct._4_4_;
  uStack_1c = QVar4.ct._8_2_;
  *(long *)&(this_00->solid_color_filler).solidColor = QVar4._0_8_;
  *(undefined4 *)((long)&(this_00->solid_color_filler).solidColor.ct + 4) = local_20;
  (this_00->solid_color_filler).solidColor.ct.argb.pad = uStack_1c;
  fVar3 = QColor::alphaF(in_RDI);
  if ((0.0 < fVar3) ||
     ((pQVar1->super_QPainterState).composition_mode != CompositionMode_SourceOver)) {
    pQVar2 = QRasterPaintEnginePrivate::clip(this_00);
    (this_00->solid_color_filler).clip = pQVar2;
    QSpanData::adjustSpanMethods(in_RDX);
    fillRect(unaff_retaddr,r_00,
             (QSpanData *)CONCAT26(in_stack_fffffffffffffff6,CONCAT24(uStack_1c,local_20)));
  }
  if (*(QRectF **)(in_FS_OFFSET + 0x28) != r_00) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QRasterPaintEngine::fillRect(const QRectF &r, const QColor &color)
{
#ifdef QT_DEBUG_DRAW
    qDebug() << "QRasterPaintEngine::fillRect(): " << r << color;
#endif
    Q_D(QRasterPaintEngine);
    QRasterPaintEngineState *s = state();

    d->solid_color_filler.solidColor = qPremultiplyWithExtraAlpha(color, s->intOpacity);

    if (d->solid_color_filler.solidColor.alphaF() <= 0.0f
        && s->composition_mode == QPainter::CompositionMode_SourceOver) {
        return;
    }
    d->solid_color_filler.clip = d->clip();
    d->solid_color_filler.adjustSpanMethods();
    fillRect(r, &d->solid_color_filler);
}